

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O3

void FIX::deleteSession(string *sender,string *target)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long *local_b0;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"store/FIX.4.2-",sender);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(target->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FIX::file_unlink((char *)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_50,"store/FIX.4.2-",sender);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(target->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FIX::file_unlink((char *)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_50,"store/FIX.4.2-",sender);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(target->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FIX::file_unlink((char *)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_50,"store/FIX.4.2-",sender);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(target->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    plVar3 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    plVar3 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FIX::file_unlink((char *)plVar3);
  if (plVar3 != &local_a0) {
    operator_delete(plVar3,local_a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void deleteSession( std::string sender, std::string target )
{
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".messages" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".header" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".seqnums" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".session" ).c_str() );
}